

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O3

Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_81ef0::Shader::create
            (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,GLuint kind,string *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined8 uVar3;
  GLuint GVar4;
  int iVar5;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  size_t sVar6;
  size_type sVar7;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_00;
  _Alloc_hider _Var8;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pEVar9;
  uint uVar10;
  int line;
  string_view sv;
  string error_string;
  int pos;
  int mod;
  GLsizei length;
  GLint compiled;
  GLchar *c_src;
  char info [2048];
  int local_8b4;
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [32];
  long local_860 [2];
  undefined1 local_850 [4];
  undefined1 local_84c [4];
  undefined4 local_848;
  int local_844;
  pointer local_840;
  char local_838 [2056];
  
  GVar4 = glCreateShader(kind);
  local_840 = (src->_M_dataplus)._M_p;
  glShaderSource(GVar4,1,&local_840,0);
  glCompileShader(GVar4);
  local_844 = 0;
  glGetShaderiv(GVar4,0x8b81,&local_844);
  if (local_844 == 1) {
    (__return_storage_ptr__->field_0).value_.name_ = GVar4;
    __return_storage_ptr__->has_value_ = true;
    ~Shader((Shader *)0x0);
    _Var8._M_p = (pointer)extraout_RAX;
  }
  else {
    local_848 = 0;
    glGetShaderInfoLog(GVar4,0x800,&local_848,local_838);
    glDeleteShader(GVar4);
    local_880._16_8_ = local_860;
    sVar6 = strlen(local_838);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_880 + 0x10),local_838,local_838 + sVar6);
    iVar5 = __isoc99_sscanf(local_838,"%d:%d(%d)",local_84c,&local_8b4,local_850);
    if (iVar5 == 3) {
      local_890._8_8_ = (src->_M_dataplus)._M_p;
      local_890._0_8_ = src->_M_string_length;
      if (((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_890._0_8_ !=
           (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0) && (-2 < local_8b4)) {
        uVar10 = 1;
        do {
          sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_890,"\n",0,1)
          ;
          uVar3 = local_890._0_8_;
          if (local_8b4 + -3 <= (int)uVar10) {
            format_abi_cxx11_((string *)local_8b0,"\n%d: ",(ulong)uVar10);
            std::__cxx11::string::_M_append(local_880 + 0x10,local_8b0._0_8_);
            if ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_8b0._0_8_ !=
                (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_8a0) {
              operator_delete((void *)local_8b0._0_8_,local_8a0._0_8_ + 1);
            }
            std::__cxx11::string::replace
                      ((ulong)(local_880 + 0x10),local_880._24_8_,(char *)0x0,local_890._8_8_);
          }
          pEVar9 = (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(sVar7 + 1);
          if ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(sVar7 + 1) ==
              (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
            pEVar9 = (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)uVar3;
          }
          local_890._8_8_ = (long)&pEVar9->field_0 + local_890._8_8_;
          local_890._0_8_ = local_890._0_8_ - (long)pEVar9;
        } while (((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_890._0_8_ !=
                  (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0) && (bVar2 = (int)uVar10 < local_8b4 + 2, uVar10 = uVar10 + 1, bVar2));
      }
    }
    format_abi_cxx11_((string *)local_890,"Shader compilation error: %s",local_880._16_8_);
    _Var8._M_p = local_8a0;
    if ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_890._0_8_ ==
        (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_880) {
      local_8a0._8_8_ = local_880._8_8_;
      pEVar9 = (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)_Var8._M_p;
    }
    else {
      local_8b0._0_8_ = local_890._0_8_;
      pEVar9 = (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_890._0_8_;
    }
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (pEVar9 == (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)_Var8._M_p) {
      paVar1->_M_allocated_capacity = local_880._0_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_8a0._8_8_;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)pEVar9;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_880._0_8_;
      _Var8._M_p = (pointer)local_880._0_8_;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_890._8_8_;
    __return_storage_ptr__->has_value_ = false;
    if ((long *)local_880._16_8_ != local_860) {
      operator_delete((void *)local_880._16_8_,local_860[0] + 1);
      _Var8._M_p = (pointer)extraout_RAX_00;
    }
  }
  return (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)_Var8._M_p;
}

Assistant:

static Expected<Shader,std::string> create(GLuint kind, const std::string& src) {
		GLuint name = glCreateShader(kind);
		GLchar const * const c_src = src.c_str();
		glShaderSource(name, 1, (const GLchar**)&c_src, nullptr);
		glCompileShader(name);

		GLint compiled = GL_FALSE;
		glGetShaderiv(name, GL_COMPILE_STATUS, &compiled);
		if (compiled != GL_TRUE) {
			GLsizei length = 0;
			char info[2048];
			glGetShaderInfoLog(name, COUNTOF(info), &length, info);
			glDeleteShader(name);

			std::string error_string = info;

			const int context = 3;
			int mod, line, pos;
			if (3 == sscanf(info, "%d:%d(%d)", &mod, &line, &pos)) {
				std::string_view sv(src);
				for (int i = 1; !sv.empty() && i < line + context; ++i) {
					size_t line_end = sv.find("\n");
					int add = 0;

					if (line_end == std::string::npos)
						line_end = sv.size();
					else add = 1;

					if (i >= line - context) {
						error_string += format("\n%d: ", i);
						error_string.append(sv.begin(), sv.begin() + line_end);
					}

					sv.remove_prefix(line_end + add);
				}
			} else {
				//error_string = src;
			}

			return Unexpected(format("Shader compilation error: %s", error_string.c_str()));
		}

		return Shader(name);
	}